

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

predictor * __thiscall Search::predictor::erase_alloweds(predictor *this)

{
  if (this->allowed_is_pointer == true) {
    (this->allowed_actions)._end = (this->allowed_actions)._begin;
  }
  else {
    v_array<unsigned_int>::clear(&this->allowed_actions);
  }
  if (this->allowed_cost_is_pointer == true) {
    (this->allowed_actions_cost)._end = (this->allowed_actions_cost)._begin;
  }
  else {
    v_array<float>::clear(&this->allowed_actions_cost);
  }
  return this;
}

Assistant:

predictor& predictor::erase_alloweds()
{
  if (allowed_is_pointer)
    allowed_actions.end() = allowed_actions.begin();
  else
    allowed_actions.clear();
  if (allowed_cost_is_pointer)
    allowed_actions_cost.end() = allowed_actions_cost.begin();
  else
    allowed_actions_cost.clear();
  return *this;
}